

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

Buffer __thiscall nvim::Nvim::create_buf(Nvim *this,bool listed,bool scratch)

{
  Buffer res;
  bool local_52;
  bool local_51;
  Buffer local_50;
  string local_48;
  
  local_52 = scratch;
  local_51 = listed;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"nvim_create_buf","");
  NvimRPC::call<bool,bool>(&this->client_,&local_48,&local_50,&local_51,&local_52);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return local_50;
}

Assistant:

Buffer Nvim::create_buf(bool listed, bool scratch) {
    Buffer res;
    client_.call("nvim_create_buf", res, listed, scratch);
    return res;
}